

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToSetAndBackupInst<false>::Exec
          (SyncToSetAndBackupInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  uint uVar3;
  bool bVar4;
  CharCount CVar5;
  uint uVar6;
  
  uVar3 = (this->super_BackupMixin).backup.lower;
  CVar5 = *matchStart;
  if (inputLength - CVar5 < uVar3) {
LAB_00eef351:
    *matchStart = inputLength;
    bVar4 = true;
  }
  else {
    uVar6 = *inputOffset;
    if (uVar6 < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0x31;
    }
    else {
      if (uVar6 - CVar5 < uVar3) {
        uVar6 = CVar5 + uVar3;
        *inputOffset = uVar6;
      }
      if (uVar6 < inputLength) {
        do {
          CVar2 = input[uVar6];
          if ((ushort)CVar2 < 0x100) {
            if (((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
                 ((ushort)CVar2 & 0x1f) & 1) != 0) break;
          }
          else if (((this->super_SetMixin<false>).set.root != (CharSetNode *)0x0) &&
                  (bVar4 = RuntimeCharSet<char16_t>::Get_helper
                                     (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2), bVar4
                  )) {
            uVar6 = *inputOffset;
            break;
          }
          if (matcher->stats != (Type)0x0) {
            puVar1 = &matcher->stats->numCompares;
            *puVar1 = *puVar1 + 1;
          }
          uVar6 = *inputOffset + 1;
          *inputOffset = uVar6;
        } while (uVar6 < inputLength);
      }
      if (inputLength <= uVar6) goto LAB_00eef351;
      *nextSyncInputOffset = uVar6 + 1;
      uVar3 = (this->super_BackupMixin).backup.upper;
      CVar5 = *matchStart;
      if (uVar3 != 0xffffffff) {
        uVar6 = *inputOffset - CVar5;
        if (uVar3 <= uVar6) {
          uVar6 = uVar3;
        }
        CVar5 = *inputOffset - uVar6;
        *matchStart = CVar5;
      }
      *inputOffset = CVar5;
      *instPointer = *instPointer + 0x31;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool SyncToSetAndBackupInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        const RuntimeCharSet<Char>& matchSet = this->set;
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Backup at most by backup.upper for new start
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }